

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall
Model_replaceImportedComponentByIndex_Test::TestBody
          (Model_replaceImportedComponentByIndex_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ModelPtr model;
  ImportSourcePtr import2;
  ComponentPtr myImportedComponent2;
  ComponentPtr myImportedComponent1;
  ImportSourcePtr import1;
  ComponentPtr myConcreteComponent2;
  ComponentPtr myConcreteComponent1;
  long *local_c0;
  long *local_b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  AssertionResult local_a8;
  long local_98 [2];
  AssertHelper local_88 [8];
  shared_ptr *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"myConcreteComponent1","");
  libcellml::Component::create(local_20);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"myImportedComponent1","");
  libcellml::Component::create((string *)&local_50);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"myConcreteComponent2","");
  libcellml::Component::create(local_30);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"myImportedComponent2","");
  libcellml::Component::create((string *)&local_60);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  libcellml::ImportSource::create();
  libcellml::ImportSource::create();
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"import1.cellml","");
  libcellml::ImportSource::setUrl(local_40);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  local_a8._0_8_ = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"import2.cellml","");
  libcellml::ImportSource::setUrl(local_70);
  if ((long *)local_a8._0_8_ != local_98) {
    operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
  }
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_50 + 0x10));
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_60 + 0x10));
  libcellml::ComponentEntity::addComponent(local_80);
  libcellml::ComponentEntity::addComponent(local_80);
  local_b8 = (long *)0x2;
  local_c0 = (long *)libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,"size_t(2)","model->componentCount()",(unsigned_long *)&local_b8,
             (unsigned_long *)&local_c0);
  if ((string)local_a8.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_a8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_a8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x456,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (local_b8 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_b8 != (long *)0x0)) {
        (**(code **)(*local_b8 + 8))();
      }
      local_b8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar1 = libcellml::ComponentEntity::replaceComponent((ulong)local_80,(shared_ptr *)0x0);
  local_b8 = (long *)CONCAT71(local_b8._1_7_,cVar1);
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar1 == '\0') {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)&local_b8,"model->replaceComponent(0, myImportedComponent1)",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x459,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if ((long *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (local_c0 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_c0 != (long *)0x0)) {
        (**(code **)(*local_c0 + 8))();
      }
      local_c0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8 = (long *)0x2;
  local_c0 = (long *)libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,"size_t(2)","model->componentCount()",(unsigned_long *)&local_b8,
             (unsigned_long *)&local_c0);
  if ((string)local_a8.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_a8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_a8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x45a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (local_b8 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_b8 != (long *)0x0)) {
        (**(code **)(*local_b8 + 8))();
      }
      local_b8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar1 = libcellml::ComponentEntity::replaceComponent((ulong)local_80,(shared_ptr *)0x1);
  local_b8 = (long *)CONCAT71(local_b8._1_7_,cVar1);
  local_b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar1 == '\0') {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a8,(char *)&local_b8,"model->replaceComponent(1, myConcreteComponent2)",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x45d,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if ((long *)local_a8._0_8_ != local_98) {
      operator_delete((void *)local_a8._0_8_,local_98[0] + 1);
    }
    if (local_c0 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_c0 != (long *)0x0)) {
        (**(code **)(*local_c0 + 8))();
      }
      local_c0 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8 = (long *)0x2;
  local_c0 = (long *)libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,"size_t(2)","model->componentCount()",(unsigned_long *)&local_b8,
             (unsigned_long *)&local_c0);
  if ((string)local_a8.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_b8);
    if (local_a8.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_a8.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/model.cpp"
               ,0x45e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if (local_b8 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_b8 != (long *)0x0)) {
        (**(code **)(*local_b8 + 8))();
      }
      local_b8 = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  return;
}

Assistant:

TEST(Model, replaceImportedComponentByIndex)
{
    auto model = libcellml::Model::create();
    auto myConcreteComponent1 = libcellml::Component::create("myConcreteComponent1");
    auto myImportedComponent1 = libcellml::Component::create("myImportedComponent1");
    auto myConcreteComponent2 = libcellml::Component::create("myConcreteComponent2");
    auto myImportedComponent2 = libcellml::Component::create("myImportedComponent2");

    auto import1 = libcellml::ImportSource::create();
    auto import2 = libcellml::ImportSource::create();

    import1->setUrl("import1.cellml");
    import2->setUrl("import2.cellml");

    myImportedComponent1->setImportSource(import1);
    myImportedComponent2->setImportSource(import2);

    model->addComponent(myConcreteComponent1);
    model->addComponent(myImportedComponent2);

    EXPECT_EQ(size_t(2), model->componentCount());

    // REPLACE concrete -> imported by index.
    EXPECT_TRUE(model->replaceComponent(0, myImportedComponent1));
    EXPECT_EQ(size_t(2), model->componentCount());

    // REPLACE imported -> concrete by index.
    EXPECT_TRUE(model->replaceComponent(1, myConcreteComponent2));
    EXPECT_EQ(size_t(2), model->componentCount());
}